

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O1

void __thiscall FRandom::PeriodCertification(FRandom *this)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  lVar3 = 0;
  uVar2 = 0;
  do {
    uVar2 = uVar2 ^ *(uint *)((long)parity + lVar3) & *(uint *)((long)&this->sfmt + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  uVar4 = 0x10;
  do {
    uVar2 = (int)uVar2 >> (sbyte)uVar4 ^ uVar2;
    bVar1 = 1 < uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar1);
  if ((uVar2 & 1) == 0) {
    *(byte *)&this->sfmt = *(byte *)&this->sfmt ^ 1;
  }
  return;
}

Assistant:

void FRandom::PeriodCertification()
{
	int inner = 0;
	int i, j;
	DWORD work;

	for (i = 0; i < 4; i++)
		inner ^= sfmt.u[idxof(i)] & parity[i];
	for (i = 16; i > 0; i >>= 1)
		inner ^= inner >> i;
	inner &= 1;
	/* check OK */
	if (inner == 1) {
		return;
	}
	/* check NG, and modification */
	for (i = 0; i < 4; i++) {
		work = 1;
		for (j = 0; j < 32; j++) {
			if ((work & parity[i]) != 0) {
				sfmt.u[idxof(i)] ^= work;
				return;
			}
			work = work << 1;
		}
	}
}